

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins.cpp
# Opt level: O1

COutPoint *
AddTestCoin(COutPoint *__return_storage_ptr__,FastRandomContext *rng,CCoinsViewCache *coins_view)

{
  long in_FS_OFFSET;
  Span<std::byte> output;
  uint256 ret;
  Coin new_coin;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  Coin local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  CTxOut::CTxOut(&local_68.out);
  local_68._40_4_ = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  output.m_size = 0x20;
  output.m_data = (byte *)&local_88;
  FastRandomContext::fillrand(rng,output);
  *(undefined8 *)
   ((__return_storage_ptr__->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) =
       local_78;
  *(undefined8 *)
   ((__return_storage_ptr__->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) =
       uStack_70;
  *(undefined8 *)(__return_storage_ptr__->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems =
       local_88;
  *(undefined8 *)
   ((__return_storage_ptr__->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) = uStack_80;
  __return_storage_ptr__->n = 0;
  local_68._40_4_ = local_68._40_4_ & 1 | 2;
  do {
    local_68.out.nValue =
         RandomMixin<FastRandomContext>::randbits(&rng->super_RandomMixin<FastRandomContext>,0x33);
  } while (2100000000000000 < (ulong)local_68.out.nValue);
  local_88 = CONCAT71(local_88._1_7_,1);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::assign
            (&local_68.out.scriptPubKey.super_CScriptBase,0x38,(uchar *)&local_88);
  CCoinsViewCache::AddCoin(coins_view,__return_storage_ptr__,&local_68,false);
  if (0x1c < local_68.out.scriptPubKey.super_CScriptBase._size) {
    free(local_68.out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect);
    local_68.out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

COutPoint AddTestCoin(FastRandomContext& rng, CCoinsViewCache& coins_view)
{
    Coin new_coin;
    COutPoint outpoint{Txid::FromUint256(rng.rand256()), /*nIn=*/0};
    new_coin.nHeight = 1;
    new_coin.out.nValue = RandMoney(rng);
    new_coin.out.scriptPubKey.assign(uint32_t{56}, 1);
    coins_view.AddCoin(outpoint, std::move(new_coin), /*possible_overwrite=*/false);

    return outpoint;
}